

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O2

void Gia_ManMarkFanoutDrivers(Gia_Man_t *p)

{
  ulong uVar1;
  Gia_Obj_t *pGVar2;
  ulong uVar3;
  int v;
  
  v = 0;
  do {
    if (p->nObjs <= v) {
      return;
    }
    pGVar2 = Gia_ManObj(p,v);
    if (pGVar2 == (Gia_Obj_t *)0x0) {
      return;
    }
    uVar1 = *(ulong *)pGVar2;
    *(ulong *)pGVar2 = uVar1 & 0xffffffffbfffffff;
    uVar3 = uVar1 & 0x1fffffff;
    if (uVar3 == 0x1fffffff || (int)uVar1 < 0) {
      if ((int)uVar1 < 0 && (int)uVar3 != 0x1fffffff) goto LAB_00216ade;
    }
    else {
      pGVar2[-uVar3].field_0x3 = pGVar2[-uVar3].field_0x3 | 0x40;
      uVar3 = (ulong)(*(uint *)&pGVar2->field_0x4 & 0x1fffffff);
LAB_00216ade:
      pGVar2[-uVar3].field_0x3 = pGVar2[-uVar3].field_0x3 | 0x40;
    }
    v = v + 1;
  } while( true );
}

Assistant:

void Gia_ManMarkFanoutDrivers( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i;
    Gia_ManForEachObj( p, pObj, i )
    {
        pObj->fMark0 = 0;
        if ( Gia_ObjIsAnd(pObj) )
        {
            Gia_ObjFanin0(pObj)->fMark0 = 1;
            Gia_ObjFanin1(pObj)->fMark0 = 1;
        }
        else if ( Gia_ObjIsCo(pObj) )
            Gia_ObjFanin0(pObj)->fMark0 = 1;
    }
}